

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void ctranspose(double *sig,int rows,int cols,double *col)

{
  if (0x3f < rows || 0x3f < cols) {
    rtranspose(sig,rows,cols,col,rows,cols);
    return;
  }
  stranspose(sig,rows,cols,col);
  return;
}

Assistant:

void ctranspose(double *sig, int rows, int cols,double *col) {
	int r,c;
	int block;

	block = (int) BLOCKSIZE;
	r= rows;
	c = cols;
	if (rows >= block || cols >= block)  {
		rtranspose(sig,rows,cols,col,r,c);
	} else {
		stranspose(sig,rows,cols,col);
	}
}